

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_2,_9,_2,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  long lVar2;
  int row;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  bool bVar7;
  undefined4 uVar8;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Mat3 m;
  float afStack_90 [6];
  float local_78 [2];
  undefined8 local_70;
  undefined4 local_68;
  Matrix<float,_3,_3> local_5c;
  Matrix<float,_3,_3> local_38;
  long lVar6;
  
  pfVar1 = (float *)&local_38;
  lVar2 = 0;
  lVar3 = 0;
  do {
    lVar4 = 0;
    auVar5 = _DAT_019fcc00;
    do {
      bVar7 = SUB164(auVar5 ^ _DAT_019f5ce0,4) == -0x80000000 &&
              SUB164(auVar5 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
      if (bVar7) {
        uVar8 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar4) = uVar8;
      }
      if (bVar7) {
        uVar8 = 0x3f800000;
        if (lVar2 + -0xc != lVar4) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar4 + 0xc) = uVar8;
      }
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x30);
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0xc;
    pfVar1 = pfVar1 + 1;
  } while (lVar3 != 3);
  local_38.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
  local_38.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
  local_38.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  local_38.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
  local_38.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
  local_38.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_38.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  afStack_90[0] = 2.2020039e-38;
  afStack_90[1] = 0.0;
  tcu::operator*(&local_5c,&local_38,(evalCtx->coords).m_data[0]);
  local_70 = (ulong)local_70._4_4_ << 0x20;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  lVar2 = 0;
  do {
    local_78[lVar2] =
         local_5c.m_data.m_data[0].m_data[lVar2] + local_5c.m_data.m_data[1].m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  afStack_90[4] = 0.0;
  afStack_90[2] = 0.0;
  afStack_90[3] = 0.0;
  lVar2 = 0;
  do {
    afStack_90[lVar2 + 2] =
         local_78[lVar2] + *(float *)((long)(local_38.m_data.m_data + -1) + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_70 = 0x100000000;
  local_68 = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[(int)local_78[lVar2]] = afStack_90[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}